

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>::copyAppend
          (QGenericArrayOps<QTextBrowserPrivate::HistoryEntry> *this,HistoryEntry *b,HistoryEntry *e
          )

{
  qsizetype *pqVar1;
  HistoryEntry *pHVar2;
  long lVar3;
  Data *pDVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  HistoryEntry *this_00;
  
  if ((b != e) && (b < e)) {
    pHVar2 = (this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).size;
      this_00 = pHVar2 + lVar3;
      QUrl::QUrl(&this_00->url,&b->url);
      pDVar4 = (b->title).d.d;
      pHVar2[lVar3].title.d.d = pDVar4;
      pHVar2[lVar3].title.d.ptr = (b->title).d.ptr;
      pHVar2[lVar3].title.d.size = (b->title).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      this_00->type = b->type;
      iVar5 = b->vpos;
      iVar6 = b->focusIndicatorPosition;
      iVar7 = b->focusIndicatorAnchor;
      this_00->hpos = b->hpos;
      this_00->vpos = iVar5;
      this_00->focusIndicatorPosition = iVar6;
      this_00->focusIndicatorAnchor = iVar7;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }